

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmLocalUnixMakefileGenerator3::WriteLocalMakefileTargets
          (cmLocalUnixMakefileGenerator3 *this,ostream *ruleFileStream,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *emitted)

{
  bool bVar1;
  TargetType TVar2;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__x;
  reference ppcVar3;
  string *psVar4;
  char *pcVar5;
  char *pcVar6;
  allocator local_231;
  string local_230;
  string local_210;
  string local_1f0;
  allocator local_1c9;
  string local_1c8;
  string local_1a8;
  undefined1 local_188 [8];
  string makeTargetName;
  string makefileName;
  string local_140;
  string local_120;
  allocator local_f9;
  string local_f8 [8];
  string makefile2;
  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_a8;
  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_a0;
  iterator t;
  string localName;
  undefined1 local_68 [8];
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *emitted_local;
  ostream *ruleFileStream_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&commands.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  __x = cmLocalGenerator::GetGeneratorTargets((cmLocalGenerator *)this);
  std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
            ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)local_68,__x);
  std::__cxx11::string::string((string *)&t);
  local_a0._M_current =
       (cmGeneratorTarget **)
       std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin
                 ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)local_68);
  do {
    local_a8._M_current =
         (cmGeneratorTarget **)
         std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end
                   ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)local_68);
    bVar1 = __gnu_cxx::operator!=(&local_a0,&local_a8);
    if (!bVar1) {
      std::__cxx11::string::~string((string *)&t);
      std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~vector
                ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)local_68);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&targets.
                    super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&commands.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      return;
    }
    ppcVar3 = __gnu_cxx::
              __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
              ::operator*(&local_a0);
    TVar2 = cmGeneratorTarget::GetType(*ppcVar3);
    if (TVar2 == EXECUTABLE) {
LAB_0079b7d9:
      ppcVar3 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&local_a0);
      psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(*ppcVar3);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(emitted,psVar4);
      ppcVar3 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&local_a0);
      GetRelativeTargetDirectory_abi_cxx11_((string *)((long)&makefile2.field_2 + 8),this,*ppcVar3);
      std::__cxx11::string::operator=((string *)&t,(string *)(makefile2.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(makefile2.field_2._M_local_buf + 8));
      std::__cxx11::string::operator+=((string *)&t,"/rule");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&targets.
                  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&commands.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pcVar5 = cmake::GetCMakeFilesDirectoryPostSlash();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f8,pcVar5,&local_f9);
      std::allocator<char>::~allocator((allocator<char> *)&local_f9);
      std::__cxx11::string::operator+=(local_f8,"Makefile2");
      pcVar5 = (char *)std::__cxx11::string::c_str();
      GetRecursiveMakeCall(&local_120,this,pcVar5,(string *)&t);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&targets.
                      super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,&local_120);
      std::__cxx11::string::~string((string *)&local_120);
      pcVar5 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)this);
      pcVar6 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_140,pcVar6,(allocator *)(makefileName.field_2._M_local_buf + 0xf))
      ;
      CreateCDCommand(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&targets.
                               super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,pcVar5,&local_140)
      ;
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator((allocator<char> *)(makefileName.field_2._M_local_buf + 0xf))
      ;
      WriteMakeRule(this,ruleFileStream,"Convenience name for target.",(string *)&t,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&commands.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&targets.
                        super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,true,false);
      ppcVar3 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&local_a0);
      psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(*ppcVar3);
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &t,psVar4);
      if (bVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&targets.
                    super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&commands.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&t);
        ppcVar3 = __gnu_cxx::
                  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                  ::operator*(&local_a0);
        psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(*ppcVar3);
        WriteMakeRule(this,ruleFileStream,"Convenience name for target.",psVar4,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&commands.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&targets.
                          super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,true,false);
      }
      ppcVar3 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&local_a0);
      GetRelativeTargetDirectory_abi_cxx11_
                ((string *)((long)&makeTargetName.field_2 + 8),this,*ppcVar3);
      std::__cxx11::string::operator+=
                ((string *)(makeTargetName.field_2._M_local_buf + 8),"/build.make");
      ppcVar3 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&local_a0);
      GetRelativeTargetDirectory_abi_cxx11_((string *)local_188,this,*ppcVar3);
      std::__cxx11::string::operator+=((string *)local_188,"/build");
      ppcVar3 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&local_a0);
      psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(*ppcVar3);
      std::__cxx11::string::operator=((string *)&t,(string *)psVar4);
      std::__cxx11::string::operator+=((string *)&t,"/fast");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&commands.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&targets.
                  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      GetRecursiveMakeCall(&local_1a8,this,pcVar5,(string *)local_188);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&targets.
                      super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,&local_1a8);
      std::__cxx11::string::~string((string *)&local_1a8);
      pcVar5 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)this);
      pcVar6 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1c8,pcVar6,&local_1c9);
      CreateCDCommand(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&targets.
                               super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,pcVar5,&local_1c8)
      ;
      std::__cxx11::string::~string((string *)&local_1c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
      WriteMakeRule(this,ruleFileStream,"fast build rule for target.",(string *)&t,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&commands.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&targets.
                        super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,true,false);
      ppcVar3 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&local_a0);
      bVar1 = cmGeneratorTarget::NeedRelinkBeforeInstall
                        (*ppcVar3,&(this->super_cmLocalCommonGenerator).ConfigName);
      if (bVar1) {
        ppcVar3 = __gnu_cxx::
                  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                  ::operator*(&local_a0);
        GetRelativeTargetDirectory_abi_cxx11_(&local_1f0,this,*ppcVar3);
        std::__cxx11::string::operator=((string *)local_188,(string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::operator+=((string *)local_188,"/preinstall");
        ppcVar3 = __gnu_cxx::
                  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                  ::operator*(&local_a0);
        psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(*ppcVar3);
        std::__cxx11::string::operator=((string *)&t,(string *)psVar4);
        std::__cxx11::string::operator+=((string *)&t,"/preinstall");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&commands.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&targets.
                    super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        GetRecursiveMakeCall(&local_210,this,pcVar5,(string *)local_188);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&targets.
                        super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_210);
        std::__cxx11::string::~string((string *)&local_210);
        pcVar5 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)this);
        pcVar6 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)this);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_230,pcVar6,&local_231);
        CreateCDCommand(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&targets.
                                 super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,pcVar5,
                        &local_230);
        std::__cxx11::string::~string((string *)&local_230);
        std::allocator<char>::~allocator((allocator<char> *)&local_231);
        WriteMakeRule(this,ruleFileStream,"Manual pre-install relink rule for target.",(string *)&t,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&commands.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&targets.
                          super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,true,false);
      }
      std::__cxx11::string::~string((string *)local_188);
      std::__cxx11::string::~string((string *)(makeTargetName.field_2._M_local_buf + 8));
      std::__cxx11::string::~string(local_f8);
    }
    else {
      ppcVar3 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&local_a0);
      TVar2 = cmGeneratorTarget::GetType(*ppcVar3);
      if (TVar2 == STATIC_LIBRARY) goto LAB_0079b7d9;
      ppcVar3 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&local_a0);
      TVar2 = cmGeneratorTarget::GetType(*ppcVar3);
      if (TVar2 == SHARED_LIBRARY) goto LAB_0079b7d9;
      ppcVar3 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&local_a0);
      TVar2 = cmGeneratorTarget::GetType(*ppcVar3);
      if (TVar2 == MODULE_LIBRARY) goto LAB_0079b7d9;
      ppcVar3 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&local_a0);
      TVar2 = cmGeneratorTarget::GetType(*ppcVar3);
      if (TVar2 == OBJECT_LIBRARY) goto LAB_0079b7d9;
      ppcVar3 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&local_a0);
      TVar2 = cmGeneratorTarget::GetType(*ppcVar3);
      if (TVar2 == UTILITY) goto LAB_0079b7d9;
    }
    __gnu_cxx::
    __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
    ::operator++(&local_a0);
  } while( true );
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteLocalMakefileTargets(
  std::ostream& ruleFileStream, std::set<std::string>& emitted)
{
  std::vector<std::string> depends;
  std::vector<std::string> commands;

  // for each target we just provide a rule to cd up to the top and do a make
  // on the target
  std::vector<cmGeneratorTarget*> targets = this->GetGeneratorTargets();
  std::string localName;
  for (std::vector<cmGeneratorTarget*>::iterator t = targets.begin();
       t != targets.end(); ++t) {
    if (((*t)->GetType() == cmStateEnums::EXECUTABLE) ||
        ((*t)->GetType() == cmStateEnums::STATIC_LIBRARY) ||
        ((*t)->GetType() == cmStateEnums::SHARED_LIBRARY) ||
        ((*t)->GetType() == cmStateEnums::MODULE_LIBRARY) ||
        ((*t)->GetType() == cmStateEnums::OBJECT_LIBRARY) ||
        ((*t)->GetType() == cmStateEnums::UTILITY)) {
      emitted.insert((*t)->GetName());

      // for subdirs add a rule to build this specific target by name.
      localName = this->GetRelativeTargetDirectory(*t);
      localName += "/rule";
      commands.clear();
      depends.clear();

      // Build the target for this pass.
      std::string makefile2 = cmake::GetCMakeFilesDirectoryPostSlash();
      makefile2 += "Makefile2";
      commands.push_back(
        this->GetRecursiveMakeCall(makefile2.c_str(), localName));
      this->CreateCDCommand(commands, this->GetBinaryDirectory(),
                            this->GetCurrentBinaryDirectory());
      this->WriteMakeRule(ruleFileStream, "Convenience name for target.",
                          localName, depends, commands, true);

      // Add a target with the canonical name (no prefix, suffix or path).
      if (localName != (*t)->GetName()) {
        commands.clear();
        depends.push_back(localName);
        this->WriteMakeRule(ruleFileStream, "Convenience name for target.",
                            (*t)->GetName(), depends, commands, true);
      }

      // Add a fast rule to build the target
      std::string makefileName = this->GetRelativeTargetDirectory(*t);
      makefileName += "/build.make";
      // make sure the makefile name is suitable for a makefile
      std::string makeTargetName = this->GetRelativeTargetDirectory(*t);
      makeTargetName += "/build";
      localName = (*t)->GetName();
      localName += "/fast";
      depends.clear();
      commands.clear();
      commands.push_back(
        this->GetRecursiveMakeCall(makefileName.c_str(), makeTargetName));
      this->CreateCDCommand(commands, this->GetBinaryDirectory(),
                            this->GetCurrentBinaryDirectory());
      this->WriteMakeRule(ruleFileStream, "fast build rule for target.",
                          localName, depends, commands, true);

      // Add a local name for the rule to relink the target before
      // installation.
      if ((*t)->NeedRelinkBeforeInstall(this->ConfigName)) {
        makeTargetName = this->GetRelativeTargetDirectory(*t);
        makeTargetName += "/preinstall";
        localName = (*t)->GetName();
        localName += "/preinstall";
        depends.clear();
        commands.clear();
        commands.push_back(
          this->GetRecursiveMakeCall(makefile2.c_str(), makeTargetName));
        this->CreateCDCommand(commands, this->GetBinaryDirectory(),
                              this->GetCurrentBinaryDirectory());
        this->WriteMakeRule(ruleFileStream,
                            "Manual pre-install relink rule for target.",
                            localName, depends, commands, true);
      }
    }
  }
}